

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

bool __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>::
matchesAny<soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType>
          (Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
           *this,TokenType t1,TokenType others,TokenType others_1,TokenType others_2)

{
  bool bVar1;
  undefined1 local_51;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  *this_local;
  TokenType others_local_2;
  TokenType others_local_1;
  TokenType others_local;
  TokenType t1_local;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                     *)this,t1);
  local_51 = true;
  if (!bVar1) {
    local_51 = matchesAny<soul::TokenType,soul::TokenType,soul::TokenType>
                         (this,others,others_1,others_2);
  }
  return local_51;
}

Assistant:

bool matchesAny (Type1 t1, Args... others) const            { return matches (t1) || matchesAny (others...); }